

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

shared_ptr<wallet::CWallet>
wallet::CWallet::Create
          (WalletContext *context,string *name,
          unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *database
          ,uint64_t wallet_creation_flags,bilingual_str *error,
          vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  OutputType OVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  bool bVar5;
  byte bVar6;
  DBErrors DVar7;
  uint uVar8;
  int iVar9;
  ArgsManager **ppAVar10;
  pointer pWVar11;
  long *plVar12;
  element_type *peVar13;
  OutputType *pOVar14;
  CAmount CVar15;
  int64_t iVar16;
  reference ppSVar17;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar18;
  CWallet *in_stack_ffffffffffffd698;
  CWallet *in_stack_ffffffffffffd6a0;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_ffffffffffffd6a8;
  undefined1 fDefault;
  bilingual_str *in_stack_ffffffffffffd6b0;
  string *in_stack_ffffffffffffd6b8;
  CWallet *in_stack_ffffffffffffd6c0;
  CWallet *in_stack_ffffffffffffd6c8;
  string *in_stack_ffffffffffffd6d0;
  undefined4 in_stack_ffffffffffffd6d8;
  undefined4 in_stack_ffffffffffffd6dc;
  undefined4 uVar19;
  CWallet *in_stack_ffffffffffffd6e0;
  ConstevalStringLiteral in_stack_ffffffffffffd6e8;
  CWallet *this;
  CWallet *in_stack_ffffffffffffd6f0;
  CWallet *in_stack_ffffffffffffd6f8;
  undefined7 in_stack_ffffffffffffd700;
  undefined1 in_stack_ffffffffffffd707;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd710;
  ConstevalFormatString<1U> in_stack_ffffffffffffd718;
  char (*in_stack_ffffffffffffd720) [10];
  bilingual_str *in_stack_ffffffffffffd728;
  string *in_stack_ffffffffffffd750;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
  *in_stack_ffffffffffffd7a8;
  undefined7 in_stack_ffffffffffffd7b0;
  undefined1 in_stack_ffffffffffffd7b7;
  Chain *in_stack_ffffffffffffd7b8;
  CWallet *in_stack_ffffffffffffd7c0;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *in_stack_ffffffffffffd7f8;
  undefined7 in_stack_ffffffffffffd800;
  CWallet *pCVar20;
  undefined1 rescan_required_00;
  Chain *chain_00;
  shared_ptr<wallet::CWallet> *in_stack_ffffffffffffd818;
  CWallet *in_stack_ffffffffffffd828;
  bool local_2799;
  bool local_26e9;
  byte local_2359;
  ScriptPubKeyMan *spk_man_2;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *__range1;
  ScriptPubKeyMan *spk_man_1;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *__range4_1;
  ScriptPubKeyMan *spk_man;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *__range4;
  bool fFirstRun;
  int local_218c;
  DBErrors nLoadWalletRet;
  bool rescan_required;
  string *walletFile;
  ArgsManager *args;
  Chain *chain;
  bilingual_str *error_local;
  uint64_t wallet_creation_flags_local;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *database_local;
  string *name_local;
  WalletContext *context_local;
  allocator<char> local_2109;
  int64_t time;
  iterator __end1;
  iterator __begin1;
  allocator<char> local_20dd;
  allocator<char> local_20dc;
  allocator<char> local_20db;
  allocator<char> local_20da;
  allocator<char> local_20d9;
  undefined8 local_20d8;
  allocator<char> local_20cb;
  allocator<char> local_20ca;
  allocator<char> local_20c9;
  CAmount local_20c8;
  allocator<char> local_20bf;
  undefined1 local_20be [2];
  undefined4 local_20bc;
  undefined8 local_20b8;
  allocator<char> local_20aa;
  allocator<char> local_20a9;
  undefined8 local_20a8;
  allocator<char> local_2092;
  allocator<char> local_2091;
  allocator<char> local_2090;
  allocator<char> local_208f;
  allocator<char> local_208e;
  allocator<char> local_208d;
  undefined4 local_208c;
  undefined8 local_2088;
  allocator<char> local_207a;
  allocator<char> local_2079;
  undefined8 local_2078;
  CAmount local_2070;
  allocator<char> local_2068;
  allocator<char> local_2067;
  allocator<char> local_2066;
  allocator<char> local_2065;
  allocator<char> local_2064;
  allocator<char> local_2063;
  allocator<char> local_2062;
  allocator<char> local_2061;
  CAmount local_2060;
  allocator<char> local_2057;
  allocator<char> local_2056;
  allocator<char> local_2055;
  allocator<char> local_2054;
  allocator<char> local_2053;
  allocator<char> local_2052;
  allocator<char> local_2051;
  CAmount local_2050;
  allocator<char> local_2045;
  allocator<char> local_2044;
  allocator<char> local_2043;
  allocator<char> local_2042;
  allocator<char> local_2041;
  allocator<char> local_2040;
  allocator<char> local_203f;
  allocator<char> local_203e;
  allocator<char> local_203d;
  allocator<char> local_203c;
  allocator<char> local_203b;
  allocator<char> local_203a;
  allocator<char> local_2039;
  CAmount local_2038;
  allocator<char> local_202c;
  allocator<char> local_202b;
  allocator<char> local_202a;
  allocator<char> local_2029;
  allocator<char> local_2028;
  allocator<char> local_2027;
  allocator<char> local_2026;
  allocator<char> local_2025;
  allocator<char> local_2024;
  allocator<char> local_2023;
  allocator<char> local_2022;
  allocator<char> local_2021;
  allocator<char> local_2020;
  allocator<char> local_201f;
  allocator<char> local_201e;
  allocator<char> local_201d;
  allocator<char> local_201c;
  allocator<char> local_201b;
  allocator<char> local_201a;
  allocator<char> local_2019;
  iterator __end4_1;
  iterator __begin4_1;
  undefined1 local_2008 [8];
  undefined8 local_2000;
  iterator __end4;
  iterator __begin4;
  allocator<char> local_1fda;
  allocator<char> local_1fd9;
  undefined8 local_1fd8;
  allocator<char> local_1fc9;
  int64_t local_1fc8;
  shared_ptr<wallet::CWallet> walletInstance;
  time_point start;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock59;
  optional<long> time_first_key;
  optional<long> consolidate_feerate;
  optional<long> max_fee_1;
  optional<long> pay_tx_fee;
  optional<long> discard_fee;
  optional<long> fallback_fee;
  optional<long> max_fee;
  optional<long> min_tx_fee;
  _Optional_payload_base<OutputType> local_1f00;
  optional<OutputType> parsed_1;
  optional<OutputType> parsed;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock58;
  string max_aps_fee;
  
  local_2000 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  plVar3 = (long *)(name->_M_dataplus)._M_p;
  ppAVar10 = inline_assertion_check<true,ArgsManager*&>
                       ((ArgsManager **)
                        CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
                        (char *)in_stack_ffffffffffffd6d0,
                        (int)((ulong)in_stack_ffffffffffffd6c8 >> 0x20),
                        (char *)in_stack_ffffffffffffd6c0,(char *)in_stack_ffffffffffffd6b8);
  this = (CWallet *)*ppAVar10;
  pWVar11 = std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::
            operator->((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                        *)in_stack_ffffffffffffd698);
  (*pWVar11->_vptr_WalletDatabase[0xc])();
  std::chrono::_V2::steady_clock::now();
  operator_new(0x4a8);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_ffffffffffffd698,
             (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             0x19c515);
  CWallet(in_stack_ffffffffffffd7c0,in_stack_ffffffffffffd7b8,
          (string *)CONCAT17(in_stack_ffffffffffffd7b7,in_stack_ffffffffffffd7b0),
          in_stack_ffffffffffffd7a8);
  std::shared_ptr<wallet::CWallet>::shared_ptr<wallet::CWallet,void(*)(wallet::CWallet*),void>
            ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd6a8.__r,in_stack_ffffffffffffd6a0,
             (_func_void_CWallet_ptr *)in_stack_ffffffffffffd698);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_ffffffffffffd6a8.__r);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  local_1fc8 = ArgsManager::GetIntArg
                         ((ArgsManager *)in_stack_ffffffffffffd6a0,
                          (string *)in_stack_ffffffffffffd698,in_stack_ffffffffffffd6a8.__r);
  local_1fd8 = 1;
  plVar12 = std::max<long>((long *)in_stack_ffffffffffffd6a0,(long *)in_stack_ffffffffffffd698);
  lVar4 = *plVar12;
  peVar13 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_ffffffffffffd698);
  peVar13->m_keypool_size = lVar4;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_1fc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  ArgsManager::GetArg((ArgsManager *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
                      in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffd698);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6f0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_1fda);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_1fd9);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffd698);
  DVar7 = LoadWallet(in_stack_ffffffffffffd6f0);
  if (DVar7 != LOAD_OK) {
    if (DVar7 == CORRUPT) {
      _(in_stack_ffffffffffffd6e8);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)in_stack_ffffffffffffd6f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6f0);
      bilingual_str::operator=
                ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                 (bilingual_str *)in_stack_ffffffffffffd6a0);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x19c841);
      goto LAB_001a2c0c;
    }
    if (DVar7 == NONCRITICAL_ERROR) {
      _(in_stack_ffffffffffffd6e8);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)in_stack_ffffffffffffd6f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6f0);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_ffffffffffffd698,
                 (value_type *)0x19ca4b);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
    }
    else {
      if (DVar7 == TOO_NEW) {
        _(in_stack_ffffffffffffd6e8);
        tinyformat::format<std::__cxx11::string,char[13]>
                  ((bilingual_str *)in_stack_ffffffffffffd718.fmt,in_stack_ffffffffffffd710,
                   (char (*) [13])in_stack_ffffffffffffd708);
        bilingual_str::operator=
                  ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                   (bilingual_str *)in_stack_ffffffffffffd6a0);
        bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
        bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
        std::shared_ptr<wallet::CWallet>::shared_ptr
                  ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x19cb57);
        goto LAB_001a2c0c;
      }
      if (DVar7 == EXTERNAL_SIGNER_SUPPORT_REQUIRED) {
        _(in_stack_ffffffffffffd6e8);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)in_stack_ffffffffffffd6f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffd6f0);
        bilingual_str::operator=
                  ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                   (bilingual_str *)in_stack_ffffffffffffd6a0);
        bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
        bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
        std::shared_ptr<wallet::CWallet>::shared_ptr
                  ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x19cc24);
        goto LAB_001a2c0c;
      }
      if (DVar7 == NEED_REWRITE) {
        _(in_stack_ffffffffffffd6e8);
        tinyformat::format<char[13]>
                  ((bilingual_str *)in_stack_ffffffffffffd6f8,
                   (char (*) [13])in_stack_ffffffffffffd6f0);
        bilingual_str::operator=
                  ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                   (bilingual_str *)in_stack_ffffffffffffd6a0);
        bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
        bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
        std::shared_ptr<wallet::CWallet>::shared_ptr
                  ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x19ccf0);
        goto LAB_001a2c0c;
      }
      if (DVar7 != NEED_RESCAN) {
        if (DVar7 == UNKNOWN_DESCRIPTOR) {
          _(in_stack_ffffffffffffd6e8);
          tinyformat::format<std::__cxx11::string>
                    ((bilingual_str *)in_stack_ffffffffffffd6f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd6f0);
          bilingual_str::operator=
                    ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                     (bilingual_str *)in_stack_ffffffffffffd6a0);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
          std::shared_ptr<wallet::CWallet>::shared_ptr
                    ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x19ceaf);
        }
        else if (DVar7 == UNEXPECTED_LEGACY_ENTRY) {
          _(in_stack_ffffffffffffd6e8);
          tinyformat::format<std::__cxx11::string>
                    ((bilingual_str *)in_stack_ffffffffffffd6f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd6f0);
          bilingual_str::operator=
                    ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                     (bilingual_str *)in_stack_ffffffffffffd6a0);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
          std::shared_ptr<wallet::CWallet>::shared_ptr
                    ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x19cf7c);
        }
        else {
          _(in_stack_ffffffffffffd6e8);
          tinyformat::format<std::__cxx11::string>
                    ((bilingual_str *)in_stack_ffffffffffffd6f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd6f0);
          bilingual_str::operator=
                    ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                     (bilingual_str *)in_stack_ffffffffffffd6a0);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
          std::shared_ptr<wallet::CWallet>::shared_ptr
                    ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x19d03b);
        }
        goto LAB_001a2c0c;
      }
      _(in_stack_ffffffffffffd6e8);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)in_stack_ffffffffffffd6f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6f0);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_ffffffffffffd698,
                 (value_type *)0x19cda2);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
    }
  }
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffd698);
  bVar5 = std::
          map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
          ::empty((map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
                   *)in_stack_ffffffffffffd698);
  local_2359 = 0;
  if (bVar5) {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffd698);
    bVar5 = IsWalletFlagSet((CWallet *)in_stack_ffffffffffffd6a8.__r,
                            (uint64_t)in_stack_ffffffffffffd6a0);
    local_2359 = 0;
    if (!bVar5) {
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_ffffffffffffd698);
      bVar5 = IsWalletFlagSet((CWallet *)in_stack_ffffffffffffd6a8.__r,
                              (uint64_t)in_stack_ffffffffffffd6a0);
      local_2359 = bVar5 ^ 0xff;
    }
  }
  if ((local_2359 & 1) == 0) {
    if (((ulong)error & 0x100000000) != 0) {
      _(in_stack_ffffffffffffd6e8);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)in_stack_ffffffffffffd6f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6f0);
      bilingual_str::operator=
                ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                 (bilingual_str *)in_stack_ffffffffffffd6a0);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x19d580);
      goto LAB_001a2c0c;
    }
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffd698);
    bVar5 = IsWalletFlagSet((CWallet *)in_stack_ffffffffffffd6a8.__r,
                            (uint64_t)in_stack_ffffffffffffd6a0);
    if (bVar5) {
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_ffffffffffffd698);
      GetActiveScriptPubKeyMans((CWallet *)in_stack_ffffffffffffd718.fmt);
      std::
      set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::begin((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
               *)in_stack_ffffffffffffd6a0);
      __end4_1 = std::
                 set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                 ::end((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                        *)in_stack_ffffffffffffd6a0);
      while (bVar5 = std::operator==((_Self *)in_stack_ffffffffffffd6a8.__r,
                                     (_Self *)in_stack_ffffffffffffd6a0), ((bVar5 ^ 0xffU) & 1) != 0
            ) {
        ppSVar17 = std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator*
                             ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
                              in_stack_ffffffffffffd698);
        uVar8 = (*(*ppSVar17)->_vptr_ScriptPubKeyMan[0xf])();
        if ((uVar8 & 1) != 0) {
          _(in_stack_ffffffffffffd6e8);
          tinyformat::format<std::__cxx11::string>
                    ((bilingual_str *)in_stack_ffffffffffffd6f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd6f0);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                    ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                     in_stack_ffffffffffffd698,(value_type *)0x19d712);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
          break;
        }
        std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator++
                  ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)in_stack_ffffffffffffd698);
      }
      std::
      set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~set((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)in_stack_ffffffffffffd698);
    }
  }
  else {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffd698);
    SetMinVersion((CWallet *)CONCAT17(in_stack_ffffffffffffd707,in_stack_ffffffffffffd700),
                  (WalletFeature)((ulong)in_stack_ffffffffffffd708 >> 0x20),
                  (WalletBatch *)in_stack_ffffffffffffd6f8);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffd698);
    InitWalletFlags(in_stack_ffffffffffffd6e0,
                    CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffd698);
    bVar5 = IsWalletFlagSet((CWallet *)in_stack_ffffffffffffd6a8.__r,
                            (uint64_t)in_stack_ffffffffffffd6a0);
    if (!bVar5) {
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_ffffffffffffd698);
      SetupLegacyScriptPubKeyMan(in_stack_ffffffffffffd6f8);
    }
    if ((((ulong)error & 0x800000000) != 0) || (((ulong)error & 0x300000000) == 0)) {
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_ffffffffffffd698);
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd698);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
                 (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd6d0,
                 (char *)in_stack_ffffffffffffd6c8,(char *)in_stack_ffffffffffffd6c0,
                 (int)((ulong)in_stack_ffffffffffffd6b8 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffd6b8 >> 0x18,0));
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_ffffffffffffd698);
      bVar5 = IsWalletFlagSet((CWallet *)in_stack_ffffffffffffd6a8.__r,
                              (uint64_t)in_stack_ffffffffffffd6a0);
      if (bVar5) {
        std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )in_stack_ffffffffffffd698);
        SetupDescriptorScriptPubKeyMans(in_stack_ffffffffffffd828);
LAB_0019d40c:
        local_218c = 0;
      }
      else {
        std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )in_stack_ffffffffffffd698);
        GetActiveScriptPubKeyMans((CWallet *)in_stack_ffffffffffffd718.fmt);
        std::
        set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
        ::begin((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                 *)in_stack_ffffffffffffd6a0);
        __end4 = std::
                 set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                 ::end((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                        *)in_stack_ffffffffffffd6a0);
        while (bVar5 = std::operator==((_Self *)in_stack_ffffffffffffd6a8.__r,
                                       (_Self *)in_stack_ffffffffffffd6a0),
              ((bVar5 ^ 0xffU) & 1) != 0) {
          ppSVar17 = std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator*
                               ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
                                in_stack_ffffffffffffd698);
          uVar8 = (*(*ppSVar17)->_vptr_ScriptPubKeyMan[0xb])(*ppSVar17,0);
          if ((uVar8 & 1) == 0) {
            _(in_stack_ffffffffffffd6e8);
            bilingual_str::operator=
                      ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                       (bilingual_str *)in_stack_ffffffffffffd6a0);
            bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
            std::shared_ptr<wallet::CWallet>::shared_ptr
                      ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x19d3a7)
            ;
            local_218c = 1;
            goto LAB_0019d3ef;
          }
          std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator++
                    ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)in_stack_ffffffffffffd698
                    );
        }
        local_218c = 2;
LAB_0019d3ef:
        std::
        set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
        ::~set((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                *)in_stack_ffffffffffffd698);
        if (local_218c == 2) goto LAB_0019d40c;
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd698);
      if (local_218c != 0) goto LAB_001a2c0c;
    }
    if (plVar3 != (long *)0x0) {
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_ffffffffffffd698);
      (**(code **)(*plVar3 + 0x28))(local_2008);
      chainStateFlushed(in_stack_ffffffffffffd6c8,
                        (ChainstateRole)((ulong)in_stack_ffffffffffffd6c0 >> 0x20),
                        (CBlockLocator *)in_stack_ffffffffffffd6b8);
      CBlockLocator::~CBlockLocator((CBlockLocator *)in_stack_ffffffffffffd698);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  ArgsManager::GetArg((ArgsManager *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
                      in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
  bVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd698);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_201a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_2019);
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    ArgsManager::GetArg((ArgsManager *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8)
                        ,in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
    ParseOutputType((string *)in_stack_ffffffffffffd6a0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_201c);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_201b);
    bVar5 = std::optional::operator_cast_to_bool((optional<OutputType> *)in_stack_ffffffffffffd698);
    if (!bVar5) {
      _(in_stack_ffffffffffffd6e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      ArgsManager::GetArg((ArgsManager *)
                          CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
                          in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)in_stack_ffffffffffffd6f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6f0);
      bilingual_str::operator=
                ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                 (bilingual_str *)in_stack_ffffffffffffd6a0);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_201e);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_201d);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x19db5f);
      goto LAB_001a2c0c;
    }
    pOVar14 = std::optional<OutputType>::value
                        ((optional<OutputType> *)in_stack_ffffffffffffd6a8.__r);
    OVar1 = *pOVar14;
    peVar13 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)in_stack_ffffffffffffd698);
    peVar13->m_default_address_type = OVar1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  ArgsManager::GetArg((ArgsManager *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
                      in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
  bVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd698);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_2020);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_201f);
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    ArgsManager::GetArg((ArgsManager *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8)
                        ,in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
    ParseOutputType((string *)in_stack_ffffffffffffd6a0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_2022);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_2021);
    bVar5 = std::optional::operator_cast_to_bool((optional<OutputType> *)in_stack_ffffffffffffd698);
    if (!bVar5) {
      _(in_stack_ffffffffffffd6e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      ArgsManager::GetArg((ArgsManager *)
                          CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
                          in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)in_stack_ffffffffffffd6f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6f0);
      bilingual_str::operator=
                ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                 (bilingual_str *)in_stack_ffffffffffffd6a0);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2024);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2023);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x19e122);
      goto LAB_001a2c0c;
    }
    std::optional<OutputType>::value((optional<OutputType> *)in_stack_ffffffffffffd6a8.__r);
    std::optional<OutputType>::optional<OutputType_&,_true>
              ((optional<OutputType> *)in_stack_ffffffffffffd6a8.__r,
               (OutputType *)in_stack_ffffffffffffd6a0);
    peVar13 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)in_stack_ffffffffffffd698);
    (peVar13->m_default_change_type).super__Optional_base<OutputType,_true,_true>._M_payload.
    super__Optional_payload_base<OutputType> = local_1f00;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  bVar5 = ArgsManager::IsArgSet((ArgsManager *)in_stack_ffffffffffffd6c0,in_stack_ffffffffffffd6b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_2025);
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    ArgsManager::GetArg((ArgsManager *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8)
                        ,in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
    ParseMoney(in_stack_ffffffffffffd750);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_2027);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_2026);
    bVar5 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd698);
    if (!bVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      ArgsManager::GetArg((ArgsManager *)
                          CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
                          in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
      common::AmountErrMsg(in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
      bilingual_str::operator=
                ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                 (bilingual_str *)in_stack_ffffffffffffd6a0);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_202a);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2029);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2028);
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x19e6a1);
      goto LAB_001a2c0c;
    }
    plVar12 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd6a8.__r);
    if (1000000 < *plVar12) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      common::AmountHighWarn(in_stack_ffffffffffffd6d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      Untranslated(in_stack_ffffffffffffd6d0);
      ::operator+(in_stack_ffffffffffffd6b0,(bilingual_str *)in_stack_ffffffffffffd6a8.__r);
      _(in_stack_ffffffffffffd6e8);
      ::operator+(in_stack_ffffffffffffd6b0,(bilingual_str *)in_stack_ffffffffffffd6a8.__r);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_ffffffffffffd698,
                 (value_type *)0x19e9e0);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_202c);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_202b);
    }
    std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd6a8.__r);
    CFeeRate::CFeeRate<long>((CFeeRate *)in_stack_ffffffffffffd698,0x19ebe1);
    peVar13 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)in_stack_ffffffffffffd698);
    (peVar13->m_min_fee).nSatoshisPerK = local_2038;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  bVar5 = ArgsManager::IsArgSet((ArgsManager *)in_stack_ffffffffffffd6c0,in_stack_ffffffffffffd6b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_2039);
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    ArgsManager::GetArg((ArgsManager *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8)
                        ,in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_203b);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_203a);
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffd6a8.__r,(char *)in_stack_ffffffffffffd6a0);
    if (bVar5) {
      peVar13 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)in_stack_ffffffffffffd698);
      peVar13->m_max_aps_fee = -1;
LAB_0019f34a:
      bVar5 = false;
    }
    else {
      ParseMoney(in_stack_ffffffffffffd750);
      bVar5 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd698);
      if (bVar5) {
        plVar12 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd6a8.__r);
        if (10000 < *plVar12) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                     (allocator<char> *)
                     CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
          common::AmountHighWarn(in_stack_ffffffffffffd6d0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                     (allocator<char> *)
                     CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
          Untranslated(in_stack_ffffffffffffd6d0);
          ::operator+(in_stack_ffffffffffffd6b0,(bilingual_str *)in_stack_ffffffffffffd6a8.__r);
          _(in_stack_ffffffffffffd6e8);
          ::operator+(in_stack_ffffffffffffd6b0,(bilingual_str *)in_stack_ffffffffffffd6a8.__r);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                    ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                     in_stack_ffffffffffffd698,(value_type *)0x19f033);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd698);
          std::allocator<char>::~allocator(&local_203d);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffd698);
          std::allocator<char>::~allocator(&local_203c);
        }
        plVar12 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd6a8.__r);
        lVar4 = *plVar12;
        peVar13 = std::
                  __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)in_stack_ffffffffffffd698);
        peVar13->m_max_aps_fee = lVar4;
        goto LAB_0019f34a;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      common::AmountErrMsg(in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
      bilingual_str::operator=
                ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                 (bilingual_str *)in_stack_ffffffffffffd6a0);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_203e);
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x19f2ed);
      bVar5 = true;
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    if (bVar5) goto LAB_001a2c0c;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  bVar5 = ArgsManager::IsArgSet((ArgsManager *)in_stack_ffffffffffffd6c0,in_stack_ffffffffffffd6b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_203f);
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    ArgsManager::GetArg((ArgsManager *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8)
                        ,in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
    ParseMoney(in_stack_ffffffffffffd750);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_2041);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_2040);
    bVar5 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd698);
    if (!bVar5) {
      _(in_stack_ffffffffffffd6e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      ArgsManager::GetArg((ArgsManager *)
                          CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
                          in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
      tinyformat::format<char[13],std::__cxx11::string>
                ((bilingual_str *)in_stack_ffffffffffffd718.fmt,
                 (char (*) [13])in_stack_ffffffffffffd710,in_stack_ffffffffffffd708);
      bilingual_str::operator=
                ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                 (bilingual_str *)in_stack_ffffffffffffd6a0);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2043);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2042);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x19f6ab);
      goto LAB_001a2c0c;
    }
    plVar12 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd6a8.__r);
    if (1000000 < *plVar12) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      common::AmountHighWarn(in_stack_ffffffffffffd6d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      Untranslated(in_stack_ffffffffffffd6d0);
      ::operator+(in_stack_ffffffffffffd6b0,(bilingual_str *)in_stack_ffffffffffffd6a8.__r);
      _(in_stack_ffffffffffffd6e8);
      ::operator+(in_stack_ffffffffffffd6b0,(bilingual_str *)in_stack_ffffffffffffd6a8.__r);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_ffffffffffffd698,
                 (value_type *)0x19f9c0);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2045);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2044);
    }
    std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd6a8.__r);
    CFeeRate::CFeeRate<long>((CFeeRate *)in_stack_ffffffffffffd698,0x19fbc1);
    peVar13 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)in_stack_ffffffffffffd698);
    (peVar13->m_fallback_fee).nSatoshisPerK = local_2050;
  }
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffd698);
  CVar15 = CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffd698);
  peVar13 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_ffffffffffffd698);
  peVar13->m_allow_fallback_fee = CVar15 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  bVar5 = ArgsManager::IsArgSet((ArgsManager *)in_stack_ffffffffffffd6c0,in_stack_ffffffffffffd6b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_2051);
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    ArgsManager::GetArg((ArgsManager *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8)
                        ,in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
    ParseMoney(in_stack_ffffffffffffd750);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_2053);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_2052);
    bVar5 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd698);
    if (!bVar5) {
      _(in_stack_ffffffffffffd6e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      ArgsManager::GetArg((ArgsManager *)
                          CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
                          in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
      tinyformat::format<char[12],std::__cxx11::string>
                ((bilingual_str *)in_stack_ffffffffffffd718.fmt,
                 (char (*) [12])in_stack_ffffffffffffd710,in_stack_ffffffffffffd708);
      bilingual_str::operator=
                ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                 (bilingual_str *)in_stack_ffffffffffffd6a0);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2055);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2054);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x19ff48);
      goto LAB_001a2c0c;
    }
    plVar12 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd6a8.__r);
    if (1000000 < *plVar12) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      common::AmountHighWarn(in_stack_ffffffffffffd6d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      Untranslated(in_stack_ffffffffffffd6d0);
      ::operator+(in_stack_ffffffffffffd6b0,(bilingual_str *)in_stack_ffffffffffffd6a8.__r);
      _(in_stack_ffffffffffffd6e8);
      ::operator+(in_stack_ffffffffffffd6b0,(bilingual_str *)in_stack_ffffffffffffd6a8.__r);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_ffffffffffffd698,
                 (value_type *)0x1a025d);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2057);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2056);
    }
    std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd6a8.__r);
    CFeeRate::CFeeRate<long>((CFeeRate *)in_stack_ffffffffffffd698,0x1a045e);
    peVar13 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)in_stack_ffffffffffffd698);
    (peVar13->m_discard_rate).nSatoshisPerK = local_2060;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  bVar5 = ArgsManager::IsArgSet((ArgsManager *)in_stack_ffffffffffffd6c0,in_stack_ffffffffffffd6b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_2061);
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    ArgsManager::GetArg((ArgsManager *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8)
                        ,in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
    ParseMoney(in_stack_ffffffffffffd750);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_2063);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_2062);
    bVar5 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd698);
    if (!bVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      ArgsManager::GetArg((ArgsManager *)
                          CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
                          in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
      common::AmountErrMsg(in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
      bilingual_str::operator=
                ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                 (bilingual_str *)in_stack_ffffffffffffd6a0);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2066);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2065);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2064);
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x1a07b3);
      goto LAB_001a2c0c;
    }
    plVar12 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd6a8.__r);
    if (1000000 < *plVar12) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      common::AmountHighWarn(in_stack_ffffffffffffd6d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      Untranslated(in_stack_ffffffffffffd6d0);
      ::operator+(in_stack_ffffffffffffd6b0,(bilingual_str *)in_stack_ffffffffffffd6a8.__r);
      _(in_stack_ffffffffffffd6e8);
      ::operator+(in_stack_ffffffffffffd6b0,(bilingual_str *)in_stack_ffffffffffffd6a8.__r);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_ffffffffffffd698,
                 (value_type *)0x1a0af2);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2068);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2067);
    }
    std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd6a8.__r);
    CFeeRate::CFeeRate((CFeeRate *)in_stack_ffffffffffffd6b8,(CAmount *)in_stack_ffffffffffffd6b0,
                       (uint32_t)((ulong)in_stack_ffffffffffffd6a8.__r >> 0x20));
    peVar13 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)in_stack_ffffffffffffd698);
    (peVar13->m_pay_tx_fee).nSatoshisPerK = local_2070;
    local_26e9 = false;
    if (plVar3 != (long *)0x0) {
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_ffffffffffffd698);
      local_2078 = (**(code **)(*plVar3 + 0xf0))();
      local_26e9 = ::operator<((CFeeRate *)in_stack_ffffffffffffd6a8.__r,
                               (CFeeRate *)in_stack_ffffffffffffd6a0);
    }
    if (local_26e9 != false) {
      _(in_stack_ffffffffffffd6e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      ArgsManager::GetArg((ArgsManager *)
                          CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
                          in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
      local_2088 = (**(code **)(*plVar3 + 0xf0))();
      local_208c = 3;
      CFeeRate::ToString_abi_cxx11_
                ((CFeeRate *)in_stack_ffffffffffffd6b0,
                 (FeeEstimateMode *)in_stack_ffffffffffffd6a8.__r);
      tinyformat::format<char[10],std::__cxx11::string,std::__cxx11::string>
                (in_stack_ffffffffffffd728,in_stack_ffffffffffffd720,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd718.fmt,in_stack_ffffffffffffd710);
      bilingual_str::operator=
                ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                 (bilingual_str *)in_stack_ffffffffffffd6a0);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_207a);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2079);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x1a0f85);
      goto LAB_001a2c0c;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  bVar5 = ArgsManager::IsArgSet((ArgsManager *)in_stack_ffffffffffffd6c0,in_stack_ffffffffffffd6b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_208d);
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    ArgsManager::GetArg((ArgsManager *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8)
                        ,in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
    ParseMoney(in_stack_ffffffffffffd750);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_208f);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_208e);
    bVar5 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd698);
    if (!bVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      ArgsManager::GetArg((ArgsManager *)
                          CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
                          in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
      common::AmountErrMsg(in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
      bilingual_str::operator=
                ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                 (bilingual_str *)in_stack_ffffffffffffd6a0);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2092);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2091);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_2090);
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x1a13b1);
      goto LAB_001a2c0c;
    }
    plVar12 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd6a8.__r);
    if (100000000 < *plVar12) {
      _(in_stack_ffffffffffffd6e8);
      tinyformat::format<char[10]>
                ((bilingual_str *)in_stack_ffffffffffffd6f8,(char (*) [10])in_stack_ffffffffffffd6f0
                );
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_ffffffffffffd698,
                 (value_type *)0x1a163c);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
    }
    local_2799 = false;
    if (plVar3 != (long *)0x0) {
      std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd6a8.__r);
      CFeeRate::CFeeRate((CFeeRate *)in_stack_ffffffffffffd6b8,(CAmount *)in_stack_ffffffffffffd6b0,
                         (uint32_t)((ulong)in_stack_ffffffffffffd6a8.__r >> 0x20));
      local_20a8 = (**(code **)(*plVar3 + 0xf0))();
      local_2799 = ::operator<((CFeeRate *)in_stack_ffffffffffffd6a8.__r,
                               (CFeeRate *)in_stack_ffffffffffffd6a0);
    }
    if (local_2799 != false) {
      _(in_stack_ffffffffffffd6e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      ArgsManager::GetArg((ArgsManager *)
                          CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
                          in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
      local_20b8 = (**(code **)(*plVar3 + 0xf0))();
      local_20bc = 3;
      CFeeRate::ToString_abi_cxx11_
                ((CFeeRate *)in_stack_ffffffffffffd6b0,
                 (FeeEstimateMode *)in_stack_ffffffffffffd6a8.__r);
      tinyformat::format<char[10],std::__cxx11::string,std::__cxx11::string>
                (in_stack_ffffffffffffd728,in_stack_ffffffffffffd720,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd718.fmt,in_stack_ffffffffffffd710);
      bilingual_str::operator=
                ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                 (bilingual_str *)in_stack_ffffffffffffd6a0);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_20aa);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_20a9);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x1a193b);
      goto LAB_001a2c0c;
    }
    plVar12 = std::optional<long>::value((optional<long> *)in_stack_ffffffffffffd6a8.__r);
    in_stack_ffffffffffffd818 = (shared_ptr<wallet::CWallet> *)*plVar12;
    peVar13 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)in_stack_ffffffffffffd698);
    peVar13->m_default_max_tx_fee = (CAmount)in_stack_ffffffffffffd818;
  }
  chain_00 = (Chain *)(local_20be + 1);
  pCVar20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  bVar6 = ArgsManager::IsArgSet((ArgsManager *)in_stack_ffffffffffffd6c0,in_stack_ffffffffffffd6b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator((allocator<char> *)(local_20be + 1));
  if ((bVar6 & 1) != 0) {
    in_stack_ffffffffffffd7f8 = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)local_20be;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    ArgsManager::GetArg((ArgsManager *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8)
                        ,in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
    ParseMoney(in_stack_ffffffffffffd750);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_20bf);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator((allocator<char> *)local_20be);
    bVar5 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd698);
    if (!bVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
      ArgsManager::GetArg((ArgsManager *)
                          CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
                          in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
      common::AmountErrMsg(in_stack_ffffffffffffd6d0,(string *)in_stack_ffffffffffffd6c8);
      bilingual_str::operator=
                ((bilingual_str *)in_stack_ffffffffffffd6a8.__r,
                 (bilingual_str *)in_stack_ffffffffffffd6a0);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_20cb);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_20ca);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd698);
      std::allocator<char>::~allocator(&local_20c9);
      std::shared_ptr<wallet::CWallet>::shared_ptr
                ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x1a1eec);
      goto LAB_001a2c0c;
    }
    std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffd698);
    CFeeRate::CFeeRate<long>((CFeeRate *)in_stack_ffffffffffffd698,0x1a1c4c);
    peVar13 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)in_stack_ffffffffffffd698);
    (peVar13->m_consolidate_feerate).nSatoshisPerK = local_20c8;
  }
  bVar5 = false;
  if (plVar3 != (long *)0x0) {
    local_20d8 = (**(code **)(*plVar3 + 0xf0))();
    CVar15 = CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffd698);
    bVar5 = 1000000 < CVar15;
  }
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    common::AmountHighWarn(in_stack_ffffffffffffd6d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    Untranslated(in_stack_ffffffffffffd6d0);
    ::operator+(in_stack_ffffffffffffd6b0,(bilingual_str *)in_stack_ffffffffffffd6a8.__r);
    _(in_stack_ffffffffffffd6e8);
    ::operator+(in_stack_ffffffffffffd6b0,(bilingual_str *)in_stack_ffffffffffffd6a8.__r);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_ffffffffffffd698,
               (value_type *)0x1a2182);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_20da);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_ffffffffffffd698);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_20d9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  iVar16 = ArgsManager::GetIntArg
                     ((ArgsManager *)in_stack_ffffffffffffd6a0,(string *)in_stack_ffffffffffffd698,
                      in_stack_ffffffffffffd6a8.__r);
  peVar13 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_ffffffffffffd698);
  peVar13->m_confirm_target = (uint)iVar16;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_20db);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  bVar5 = ArgsManager::GetBoolArg
                    ((ArgsManager *)in_stack_ffffffffffffd6a0,(string *)in_stack_ffffffffffffd698,
                     SUB81((ulong)in_stack_ffffffffffffd6a8.__r >> 0x38,0));
  peVar13 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_ffffffffffffd698);
  peVar13->m_spend_zero_conf_change = bVar5;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_20dc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd6e8.lit,(char *)in_stack_ffffffffffffd6e0,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
  bVar5 = ArgsManager::GetBoolArg
                    ((ArgsManager *)in_stack_ffffffffffffd6a0,(string *)in_stack_ffffffffffffd698,
                     SUB81((ulong)in_stack_ffffffffffffd6a8.__r >> 0x38,0));
  peVar13 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_ffffffffffffd698);
  peVar13->m_signal_rbf = bVar5;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  std::allocator<char>::~allocator(&local_20dd);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffd698);
  std::chrono::_V2::steady_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_ffffffffffffd6a0,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_ffffffffffffd698);
  Ticks<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (in_stack_ffffffffffffd6a8);
  WalletLogPrintf<long>
            ((CWallet *)in_stack_ffffffffffffd6e8.lit,in_stack_ffffffffffffd718,
             (long *)in_stack_ffffffffffffd6e0);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffd698);
  TopUpKeyPool((CWallet *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
               (uint)((ulong)in_stack_ffffffffffffd6d0 >> 0x20));
  std::optional<long>::optional((optional<long> *)in_stack_ffffffffffffd698);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffd698);
  GetAllScriptPubKeyMans((CWallet *)in_stack_ffffffffffffd6e8.lit);
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::begin((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
           *)in_stack_ffffffffffffd6a0);
  __end1 = std::
           set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
           ::end((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                  *)in_stack_ffffffffffffd6a0);
  while( true ) {
    bVar5 = std::operator==((_Self *)in_stack_ffffffffffffd6a8.__r,
                            (_Self *)in_stack_ffffffffffffd6a0);
    rescan_required_00 = (undefined1)((ulong)pCVar20 >> 0x38);
    if (((bVar5 ^ 0xffU) & 1) == 0) break;
    ppSVar17 = std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator*
                         ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
                          in_stack_ffffffffffffd698);
    iVar9 = (*(*ppSVar17)->_vptr_ScriptPubKeyMan[0x13])();
    in_stack_ffffffffffffd718.fmt = (char *)CONCAT44(extraout_var,iVar9);
    time = (int64_t)in_stack_ffffffffffffd718.fmt;
    bVar5 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd698);
    if ((!bVar5) ||
       (iVar16 = time,
       plVar12 = std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffd698),
       iVar16 < *plVar12)) {
      std::optional<long>::optional<long_&,_true>
                ((optional<long> *)in_stack_ffffffffffffd6a8.__r,(long *)in_stack_ffffffffffffd6a0);
    }
    std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator++
              ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)in_stack_ffffffffffffd698);
  }
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~set((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
          *)in_stack_ffffffffffffd698);
  fDefault = (undefined1)((ulong)in_stack_ffffffffffffd6a8.__r >> 0x38);
  bVar5 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffd698);
  if (bVar5) {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffd698);
    std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffd698);
    MaybeUpdateBirthTime(in_stack_ffffffffffffd6c0,(int64_t)in_stack_ffffffffffffd6b8);
  }
  if ((plVar3 == (long *)0x0) ||
     (bVar5 = AttachChain(in_stack_ffffffffffffd818,chain_00,(bool)rescan_required_00,
                          (bilingual_str *)CONCAT17(bVar6,in_stack_ffffffffffffd800),
                          in_stack_ffffffffffffd7f8), bVar5)) {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffd698);
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd698);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8),
               (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd6d0,
               (char *)in_stack_ffffffffffffd6c8,(char *)in_stack_ffffffffffffd6c0,
               (int)((ulong)in_stack_ffffffffffffd6b8 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffd6b8 >> 0x18,0));
    peVar13 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)in_stack_ffffffffffffd698);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (char *)peVar13,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffd6dc,in_stack_ffffffffffffd6d8));
    bVar5 = ArgsManager::GetBoolArg
                      ((ArgsManager *)in_stack_ffffffffffffd6a0,(string *)in_stack_ffffffffffffd698,
                       (bool)fDefault);
    uVar19 = CONCAT13(bVar5,(int3)in_stack_ffffffffffffd6dc);
    SetBroadcastTransactions(in_stack_ffffffffffffd698,false);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd698);
    std::allocator<char>::~allocator(&local_2109);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffd698);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffd698);
    GetKeyPoolSize((CWallet *)CONCAT44(uVar19,in_stack_ffffffffffffd6d8));
    WalletLogPrintf<unsigned_int>(this,in_stack_ffffffffffffd718,(uint *)peVar13);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffd698);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffd698);
    std::
    unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
    ::size((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
            *)in_stack_ffffffffffffd698);
    WalletLogPrintf<unsigned_long>(this,in_stack_ffffffffffffd718,(unsigned_long *)peVar13);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffd698);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffd698);
    std::
    map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
    ::size((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
            *)in_stack_ffffffffffffd698);
    WalletLogPrintf<unsigned_long>(this,in_stack_ffffffffffffd718,(unsigned_long *)peVar13);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd698);
    std::shared_ptr<wallet::CWallet>::shared_ptr
              ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,
               (shared_ptr<wallet::CWallet> *)0x1a2b8a);
  }
  else {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffd698);
    std::unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_>::reset
              ((unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> *)
               in_stack_ffffffffffffd698,(pointer)0x1a2935);
    std::shared_ptr<wallet::CWallet>::shared_ptr
              ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698,(nullptr_t)0x1a2946);
  }
LAB_001a2c0c:
  std::shared_ptr<wallet::CWallet>::~shared_ptr
            ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffd698);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd698);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  sVar18.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar18.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)context;
  return (shared_ptr<wallet::CWallet>)
         sVar18.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CWallet> CWallet::Create(WalletContext& context, const std::string& name, std::unique_ptr<WalletDatabase> database, uint64_t wallet_creation_flags, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    interfaces::Chain* chain = context.chain;
    ArgsManager& args = *Assert(context.args);
    const std::string& walletFile = database->Filename();

    const auto start{SteadyClock::now()};
    // TODO: Can't use std::make_shared because we need a custom deleter but
    // should be possible to use std::allocate_shared.
    std::shared_ptr<CWallet> walletInstance(new CWallet(chain, name, std::move(database)), FlushAndDeleteWallet);
    walletInstance->m_keypool_size = std::max(args.GetIntArg("-keypool", DEFAULT_KEYPOOL_SIZE), int64_t{1});
    walletInstance->m_notify_tx_changed_script = args.GetArg("-walletnotify", "");

    // Load wallet
    bool rescan_required = false;
    DBErrors nLoadWalletRet = walletInstance->LoadWallet();
    if (nLoadWalletRet != DBErrors::LOAD_OK) {
        if (nLoadWalletRet == DBErrors::CORRUPT) {
            error = strprintf(_("Error loading %s: Wallet corrupted"), walletFile);
            return nullptr;
        }
        else if (nLoadWalletRet == DBErrors::NONCRITICAL_ERROR)
        {
            warnings.push_back(strprintf(_("Error reading %s! All keys read correctly, but transaction data"
                                           " or address metadata may be missing or incorrect."),
                walletFile));
        }
        else if (nLoadWalletRet == DBErrors::TOO_NEW) {
            error = strprintf(_("Error loading %s: Wallet requires newer version of %s"), walletFile, PACKAGE_NAME);
            return nullptr;
        }
        else if (nLoadWalletRet == DBErrors::EXTERNAL_SIGNER_SUPPORT_REQUIRED) {
            error = strprintf(_("Error loading %s: External signer wallet being loaded without external signer support compiled"), walletFile);
            return nullptr;
        }
        else if (nLoadWalletRet == DBErrors::NEED_REWRITE)
        {
            error = strprintf(_("Wallet needed to be rewritten: restart %s to complete"), PACKAGE_NAME);
            return nullptr;
        } else if (nLoadWalletRet == DBErrors::NEED_RESCAN) {
            warnings.push_back(strprintf(_("Error reading %s! Transaction data may be missing or incorrect."
                                           " Rescanning wallet."), walletFile));
            rescan_required = true;
        } else if (nLoadWalletRet == DBErrors::UNKNOWN_DESCRIPTOR) {
            error = strprintf(_("Unrecognized descriptor found. Loading wallet %s\n\n"
                                "The wallet might had been created on a newer version.\n"
                                "Please try running the latest software version.\n"), walletFile);
            return nullptr;
        } else if (nLoadWalletRet == DBErrors::UNEXPECTED_LEGACY_ENTRY) {
            error = strprintf(_("Unexpected legacy entry in descriptor wallet found. Loading wallet %s\n\n"
                                "The wallet might have been tampered with or created with malicious intent.\n"), walletFile);
            return nullptr;
        } else {
            error = strprintf(_("Error loading %s"), walletFile);
            return nullptr;
        }
    }

    // This wallet is in its first run if there are no ScriptPubKeyMans and it isn't blank or no privkeys
    const bool fFirstRun = walletInstance->m_spk_managers.empty() &&
                     !walletInstance->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS) &&
                     !walletInstance->IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET);
    if (fFirstRun)
    {
        // ensure this wallet.dat can only be opened by clients supporting HD with chain split and expects no default key
        walletInstance->SetMinVersion(FEATURE_LATEST);

        walletInstance->InitWalletFlags(wallet_creation_flags);

        // Only create LegacyScriptPubKeyMan when not descriptor wallet
        if (!walletInstance->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
            walletInstance->SetupLegacyScriptPubKeyMan();
        }

        if ((wallet_creation_flags & WALLET_FLAG_EXTERNAL_SIGNER) || !(wallet_creation_flags & (WALLET_FLAG_DISABLE_PRIVATE_KEYS | WALLET_FLAG_BLANK_WALLET))) {
            LOCK(walletInstance->cs_wallet);
            if (walletInstance->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
                walletInstance->SetupDescriptorScriptPubKeyMans();
                // SetupDescriptorScriptPubKeyMans already calls SetupGeneration for us so we don't need to call SetupGeneration separately
            } else {
                // Legacy wallets need SetupGeneration here.
                for (auto spk_man : walletInstance->GetActiveScriptPubKeyMans()) {
                    if (!spk_man->SetupGeneration()) {
                        error = _("Unable to generate initial keys");
                        return nullptr;
                    }
                }
            }
        }

        if (chain) {
            walletInstance->chainStateFlushed(ChainstateRole::NORMAL, chain->getTipLocator());
        }
    } else if (wallet_creation_flags & WALLET_FLAG_DISABLE_PRIVATE_KEYS) {
        // Make it impossible to disable private keys after creation
        error = strprintf(_("Error loading %s: Private keys can only be disabled during creation"), walletFile);
        return nullptr;
    } else if (walletInstance->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        for (auto spk_man : walletInstance->GetActiveScriptPubKeyMans()) {
            if (spk_man->HavePrivateKeys()) {
                warnings.push_back(strprintf(_("Warning: Private keys detected in wallet {%s} with disabled private keys"), walletFile));
                break;
            }
        }
    }

    if (!args.GetArg("-addresstype", "").empty()) {
        std::optional<OutputType> parsed = ParseOutputType(args.GetArg("-addresstype", ""));
        if (!parsed) {
            error = strprintf(_("Unknown address type '%s'"), args.GetArg("-addresstype", ""));
            return nullptr;
        }
        walletInstance->m_default_address_type = parsed.value();
    }

    if (!args.GetArg("-changetype", "").empty()) {
        std::optional<OutputType> parsed = ParseOutputType(args.GetArg("-changetype", ""));
        if (!parsed) {
            error = strprintf(_("Unknown change type '%s'"), args.GetArg("-changetype", ""));
            return nullptr;
        }
        walletInstance->m_default_change_type = parsed.value();
    }

    if (args.IsArgSet("-mintxfee")) {
        std::optional<CAmount> min_tx_fee = ParseMoney(args.GetArg("-mintxfee", ""));
        if (!min_tx_fee) {
            error = AmountErrMsg("mintxfee", args.GetArg("-mintxfee", ""));
            return nullptr;
        } else if (min_tx_fee.value() > HIGH_TX_FEE_PER_KB) {
            warnings.push_back(AmountHighWarn("-mintxfee") + Untranslated(" ") +
                               _("This is the minimum transaction fee you pay on every transaction."));
        }

        walletInstance->m_min_fee = CFeeRate{min_tx_fee.value()};
    }

    if (args.IsArgSet("-maxapsfee")) {
        const std::string max_aps_fee{args.GetArg("-maxapsfee", "")};
        if (max_aps_fee == "-1") {
            walletInstance->m_max_aps_fee = -1;
        } else if (std::optional<CAmount> max_fee = ParseMoney(max_aps_fee)) {
            if (max_fee.value() > HIGH_APS_FEE) {
                warnings.push_back(AmountHighWarn("-maxapsfee") + Untranslated(" ") +
                                  _("This is the maximum transaction fee you pay (in addition to the normal fee) to prioritize partial spend avoidance over regular coin selection."));
            }
            walletInstance->m_max_aps_fee = max_fee.value();
        } else {
            error = AmountErrMsg("maxapsfee", max_aps_fee);
            return nullptr;
        }
    }

    if (args.IsArgSet("-fallbackfee")) {
        std::optional<CAmount> fallback_fee = ParseMoney(args.GetArg("-fallbackfee", ""));
        if (!fallback_fee) {
            error = strprintf(_("Invalid amount for %s=<amount>: '%s'"), "-fallbackfee", args.GetArg("-fallbackfee", ""));
            return nullptr;
        } else if (fallback_fee.value() > HIGH_TX_FEE_PER_KB) {
            warnings.push_back(AmountHighWarn("-fallbackfee") + Untranslated(" ") +
                               _("This is the transaction fee you may pay when fee estimates are not available."));
        }
        walletInstance->m_fallback_fee = CFeeRate{fallback_fee.value()};
    }

    // Disable fallback fee in case value was set to 0, enable if non-null value
    walletInstance->m_allow_fallback_fee = walletInstance->m_fallback_fee.GetFeePerK() != 0;

    if (args.IsArgSet("-discardfee")) {
        std::optional<CAmount> discard_fee = ParseMoney(args.GetArg("-discardfee", ""));
        if (!discard_fee) {
            error = strprintf(_("Invalid amount for %s=<amount>: '%s'"), "-discardfee", args.GetArg("-discardfee", ""));
            return nullptr;
        } else if (discard_fee.value() > HIGH_TX_FEE_PER_KB) {
            warnings.push_back(AmountHighWarn("-discardfee") + Untranslated(" ") +
                               _("This is the transaction fee you may discard if change is smaller than dust at this level"));
        }
        walletInstance->m_discard_rate = CFeeRate{discard_fee.value()};
    }

    if (args.IsArgSet("-paytxfee")) {
        std::optional<CAmount> pay_tx_fee = ParseMoney(args.GetArg("-paytxfee", ""));
        if (!pay_tx_fee) {
            error = AmountErrMsg("paytxfee", args.GetArg("-paytxfee", ""));
            return nullptr;
        } else if (pay_tx_fee.value() > HIGH_TX_FEE_PER_KB) {
            warnings.push_back(AmountHighWarn("-paytxfee") + Untranslated(" ") +
                               _("This is the transaction fee you will pay if you send a transaction."));
        }

        walletInstance->m_pay_tx_fee = CFeeRate{pay_tx_fee.value(), 1000};

        if (chain && walletInstance->m_pay_tx_fee < chain->relayMinFee()) {
            error = strprintf(_("Invalid amount for %s=<amount>: '%s' (must be at least %s)"),
                "-paytxfee", args.GetArg("-paytxfee", ""), chain->relayMinFee().ToString());
            return nullptr;
        }
    }

    if (args.IsArgSet("-maxtxfee")) {
        std::optional<CAmount> max_fee = ParseMoney(args.GetArg("-maxtxfee", ""));
        if (!max_fee) {
            error = AmountErrMsg("maxtxfee", args.GetArg("-maxtxfee", ""));
            return nullptr;
        } else if (max_fee.value() > HIGH_MAX_TX_FEE) {
            warnings.push_back(strprintf(_("%s is set very high! Fees this large could be paid on a single transaction."), "-maxtxfee"));
        }

        if (chain && CFeeRate{max_fee.value(), 1000} < chain->relayMinFee()) {
            error = strprintf(_("Invalid amount for %s=<amount>: '%s' (must be at least the minrelay fee of %s to prevent stuck transactions)"),
                "-maxtxfee", args.GetArg("-maxtxfee", ""), chain->relayMinFee().ToString());
            return nullptr;
        }

        walletInstance->m_default_max_tx_fee = max_fee.value();
    }

    if (args.IsArgSet("-consolidatefeerate")) {
        if (std::optional<CAmount> consolidate_feerate = ParseMoney(args.GetArg("-consolidatefeerate", ""))) {
            walletInstance->m_consolidate_feerate = CFeeRate(*consolidate_feerate);
        } else {
            error = AmountErrMsg("consolidatefeerate", args.GetArg("-consolidatefeerate", ""));
            return nullptr;
        }
    }

    if (chain && chain->relayMinFee().GetFeePerK() > HIGH_TX_FEE_PER_KB) {
        warnings.push_back(AmountHighWarn("-minrelaytxfee") + Untranslated(" ") +
                           _("The wallet will avoid paying less than the minimum relay fee."));
    }

    walletInstance->m_confirm_target = args.GetIntArg("-txconfirmtarget", DEFAULT_TX_CONFIRM_TARGET);
    walletInstance->m_spend_zero_conf_change = args.GetBoolArg("-spendzeroconfchange", DEFAULT_SPEND_ZEROCONF_CHANGE);
    walletInstance->m_signal_rbf = args.GetBoolArg("-walletrbf", DEFAULT_WALLET_RBF);

    walletInstance->WalletLogPrintf("Wallet completed loading in %15dms\n", Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));

    // Try to top up keypool. No-op if the wallet is locked.
    walletInstance->TopUpKeyPool();

    // Cache the first key time
    std::optional<int64_t> time_first_key;
    for (auto spk_man : walletInstance->GetAllScriptPubKeyMans()) {
        int64_t time = spk_man->GetTimeFirstKey();
        if (!time_first_key || time < *time_first_key) time_first_key = time;
    }
    if (time_first_key) walletInstance->MaybeUpdateBirthTime(*time_first_key);

    if (chain && !AttachChain(walletInstance, *chain, rescan_required, error, warnings)) {
        walletInstance->m_chain_notifications_handler.reset(); // Reset this pointer so that the wallet will actually be unloaded
        return nullptr;
    }

    {
        LOCK(walletInstance->cs_wallet);
        walletInstance->SetBroadcastTransactions(args.GetBoolArg("-walletbroadcast", DEFAULT_WALLETBROADCAST));
        walletInstance->WalletLogPrintf("setKeyPool.size() = %u\n",      walletInstance->GetKeyPoolSize());
        walletInstance->WalletLogPrintf("mapWallet.size() = %u\n",       walletInstance->mapWallet.size());
        walletInstance->WalletLogPrintf("m_address_book.size() = %u\n",  walletInstance->m_address_book.size());
    }

    return walletInstance;
}